

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

short __thiscall QLocale::toShort(QLocale *this,QStringView s,bool *ok)

{
  QLocalePrivate *pQVar1;
  short sVar2;
  long lVar3;
  QSimpleParsedNumber<long_long> QVar5;
  long lVar4;
  
  pQVar1 = (this->d).d.ptr;
  QVar5 = QLocaleData::stringToLongLong
                    (pQVar1->m_data,s,10,
                     (NumberOptions)
                     (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                     super_QFlagsStorage<QLocale::NumberOption>.i);
  lVar3 = QVar5.result;
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar5.used;
  }
  lVar4 = 0;
  if ((short)QVar5.result == lVar3) {
    lVar4 = lVar3;
  }
  sVar2 = (short)lVar4;
  if ((ok != (bool *)0x0) && (0xffff < lVar3 + 0x8000U)) {
    *ok = false;
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

short QLocale::toShort(QStringView s, bool *ok) const
{
    return toIntegral_helper<short>(d, s, ok);
}